

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

JitTypePropertyGuard * __thiscall
Lowerer::CreateTypePropertyGuardForGuardedProperties
          (Lowerer *this,JITTypeHolder type,PropertySymOpnd *propertySymOpnd)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Func *this_00;
  long lVar2;
  code *pcVar3;
  int iVar4;
  Lowerer *pLVar5;
  bool bVar6;
  uint id;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  FunctionJITTimeInfo *pFVar10;
  ObjTypeSpecFldInfo *this_01;
  JITType *this_02;
  intptr_t typeAddr;
  JitTypePropertyGuard *pJVar11;
  JITTimeFunctionBody *this_03;
  char16 *pcVar12;
  char16 *pcVar13;
  wchar local_d8 [44];
  ulong local_80;
  BVSparse<Memory::JitArenaAllocator> *local_78;
  BVUnitT<unsigned_long> local_70;
  Lowerer *local_68;
  JITTypeHolderBase<void> local_60;
  JitTypePropertyGuard **local_58;
  JitTypePropertyGuard *local_50;
  JitTypePropertyGuard *guard;
  Phases *local_40;
  uint local_34;
  
  if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ee7,"(propertySymOpnd->GetGuardedPropOps() != nullptr)",
                       "propertySymOpnd->GetGuardedPropOps() != nullptr");
    if (!bVar6) goto LAB_0056cd5a;
    *puVar9 = 0;
  }
  local_50 = (JitTypePropertyGuard *)0x0;
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar10);
  if (bVar6) {
    pBVar1 = propertySymOpnd->guardedPropOps;
    local_58 = &local_50;
    local_68 = this;
    local_60.t = type.t;
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar10);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd8,
                         "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                         ,"this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                        );
      if (!bVar6) goto LAB_0056cd5a;
      *puVar9 = 0;
    }
    if (pBVar1 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
      if (!bVar6) {
LAB_0056cd5a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    else {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    local_40 = (Phases *)&DAT_01453738;
    local_78 = pBVar1;
    guard = (JitTypePropertyGuard *)this;
    while (local_78 = (BVSparse<Memory::JitArenaAllocator> *)local_78->head,
          local_78 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      local_80 = (ulong)*(uint *)&local_78->lastFoundIndex;
      local_70.word = ((Type *)&local_78->alloc)->word;
      while (local_70.word != 0) {
        lVar2 = 0;
        if (local_70.word != 0) {
          for (; (local_70.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        iVar4 = (int)local_80;
        BVUnitT<unsigned_long>::Clear(&local_70,(BVIndex)lVar2);
        this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,iVar4 + (BVIndex)lVar2);
        id = ObjTypeSpecFldInfo::GetPropertyId(this_01);
        bVar6 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
        if (((bVar6) || (bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar6)) ||
           (bVar6 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar6)) {
          bVar6 = ObjTypeSpecFldInfo::IsPoly(this_01);
          if (((bVar6) && (bVar6 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar6)) &&
             ((bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar6 &&
              (bVar6 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar6)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1fee,
                               "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                               ,
                               "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                              );
            if (!bVar6) goto LAB_0056cd5a;
            *puVar9 = 0;
          }
          pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar10,id);
          pLVar5 = local_68;
          if (bVar6) {
            local_34 = id;
            bVar6 = ShouldDoLazyFixedTypeBailout(local_68->m_func);
            if (bVar6) {
              JsUtil::
              BaseHashSet<int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::Item(&pLVar5->m_func->lazyBailoutProperties,(int *)&local_34);
              this = (Lowerer *)guard;
            }
            else {
              if (*local_58 == (JitTypePropertyGuard *)0x0) {
                this_00 = pLVar5->m_func;
                this_02 = JITTypeHolderBase<void>::operator->(&local_60);
                typeAddr = JITType::GetAddr(this_02);
                pJVar11 = Func::GetOrCreateSingleTypeGuard(this_00,typeAddr);
                *local_58 = pJVar11;
              }
              uVar7 = Func::GetSourceContextId(pLVar5->m_func);
              uVar8 = Func::GetLocalFunctionId(pLVar5->m_func);
              bVar6 = Js::Phases::IsEnabled(local_40,ObjTypeSpecPhase,uVar7,uVar8);
              if (bVar6) {
LAB_0056ccc6:
                this_03 = Func::GetJITFunctionBody(pLVar5->m_func);
                pcVar12 = JITTimeFunctionBody::GetDisplayName(this_03);
                pcVar13 = Func::GetDebugNumberSet(pLVar5->m_func,(wchar (*) [42])local_d8);
                Output::Print(L"ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"
                              ,pcVar12,pcVar13,*local_58,
                              ((*local_58)->super_JitIndexedPropertyGuard).super_PropertyGuard.value
                              ,(ulong)id);
                Output::Flush();
              }
              else {
                uVar7 = Func::GetSourceContextId(pLVar5->m_func);
                uVar8 = Func::GetLocalFunctionId(pLVar5->m_func);
                bVar6 = Js::Phases::IsEnabled(local_40,TracePropertyGuardsPhase,uVar7,uVar8);
                if (bVar6) goto LAB_0056ccc6;
              }
              Func::EnsurePropertyGuardsByPropertyId(pLVar5->m_func);
              Func::LinkGuardToPropertyId
                        (pLVar5->m_func,id,&(*local_58)->super_JitIndexedPropertyGuard);
              this = (Lowerer *)guard;
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1ff7,"(false)",
                               "Did we fail to create a shared property guard for a guarded property?"
                              );
            if (!bVar6) goto LAB_0056cd5a;
            *puVar9 = 0;
          }
        }
      }
    }
  }
  else {
    local_50 = (JitTypePropertyGuard *)0x0;
  }
  return local_50;
}

Assistant:

Js::JitTypePropertyGuard*
Lowerer::CreateTypePropertyGuardForGuardedProperties(JITTypeHolder type, IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->GetGuardedPropOps() != nullptr);

    Js::JitTypePropertyGuard* guard = nullptr;

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        // Consider (ObjTypeSpec): Because we allocate these guards from the JIT thread we can't share guards for the same type across multiple functions.
        // This leads to proliferation of property guards on the thread context.  The alternative would be to pre-allocate shared (by value) guards
        // from the thread context during work item creation.  We would create too many of them (because some types aren't actually used as guards),
        // but we could share a guard for a given type between functions.  This may ultimately be better.

        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [this, type, &guard](Js::PropertyId propertyId)
        {
            if (ShouldDoLazyFixedTypeBailout(this->m_func))
            {
                this->m_func->lazyBailoutProperties.Item(propertyId);
            }
            else
            {
                if (guard == nullptr)
                {
                    guard = this->m_func->GetOrCreateSingleTypeGuard(type->GetAddr());
                }

                if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                        guard, guard->GetValue(), propertyId);
                    Output::Flush();
                }

                this->m_func->EnsurePropertyGuardsByPropertyId();
                this->m_func->LinkGuardToPropertyId(propertyId, guard);
            }
        });
    }

    return guard;
}